

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::makeDebugDeclare(Builder *this,Id debugLocalVariable,Id pointer)

{
  Id IVar1;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  Id IVar2;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  
  this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       operator_new(0x60);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  IVar1 = makeVoidType(this);
  *(undefined ***)
   this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_00927e68;
  *(Id *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar2;
  *(Id *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = IVar1;
  *(Op *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = OpExtInst;
  (((_Bit_iterator *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x40))->
  super__Bit_iterator_base)._M_p = (_Bit_type *)0x0;
  *(uint *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x48) = 0;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
  *(pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
  (((vector<bool,_std::allocator<bool>_> *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30))->
  super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x38) = 0;
  *(_Bit_pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x50) = (_Bit_pointer)0x0
  ;
  *(Block **)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x58) = (Block *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)this_00.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),5);
  if (*(_Bit_pointer *)
       ((long)this_00.
              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
              super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x50) ==
      (((vector<bool,_std::allocator<bool>_> *)
       ((long)this_00.
              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
              super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30))->
      super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p) {
    std::vector<bool,_std::allocator<bool>_>::_M_reallocate
              ((vector<bool,_std::allocator<bool>_> *)
               ((long)this_00.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30),5);
  }
  Instruction::addIdOperand
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,
             this->nonSemanticShaderDebugInfo);
  Instruction::addImmediateOperand
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,0x1c);
  Instruction::addIdOperand
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,debugLocalVariable);
  Instruction::addIdOperand
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,pointer);
  IVar1 = makeDebugExpression(this);
  Instruction::addIdOperand
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,IVar1);
  local_30._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_30);
  if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
      local_30._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
  }
  return *(Id *)((long)this_00.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
}

Assistant:

Id Builder::makeDebugDeclare(Id const debugLocalVariable, Id const pointer)
{
    Instruction* inst = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    inst->reserveOperands(5);
    inst->addIdOperand(nonSemanticShaderDebugInfo);
    inst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugDeclare);
    inst->addIdOperand(debugLocalVariable); // debug local variable id
    inst->addIdOperand(pointer); // pointer to local variable id
    inst->addIdOperand(makeDebugExpression()); // expression id
    addInstruction(std::unique_ptr<Instruction>(inst));

    return inst->getResultId();
}